

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O3

Value * cmDumpCodeModel(Value *__return_storage_ptr__,cmake *cm)

{
  cmMakefile *this;
  _Base_ptr p_Var1;
  long *plVar2;
  undefined8 *puVar3;
  cmake *pcVar4;
  bool bVar5;
  Value *pVVar6;
  char *value;
  string *psVar7;
  ulong uVar8;
  long lVar9;
  _Base_ptr p_Var10;
  cmake *cm_00;
  cmLocalGenerator **lgIt;
  undefined8 *puVar11;
  _Base_ptr p_Var12;
  string *value_00;
  long *plVar13;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  Value pObj;
  undefined8 *local_268;
  undefined8 *puStack_260;
  long local_258;
  Value *local_250;
  ValueHolder local_248;
  undefined8 *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  cmake *local_220;
  string *local_218;
  string *local_210;
  _Rb_tree_node_base *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_250 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_1c0,arrayValue);
  (anonymous_namespace)::getConfigurations_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)cm->GlobalGenerator,cm_00);
  local_218 = local_200.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  value_00 = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = cm;
  if (local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_220 = pcVar4;
      Json::Value::Value(&local_170,objectValue);
      Json::Value::Value(&local_120,value_00);
      pVVar6 = Json::Value::operator[](&local_170,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_120);
      Json::Value::~Value(&local_120);
      Json::Value::Value(&local_148,arrayValue);
      p_Var10 = (cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      local_208 = &(cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header;
      psVar7 = value_00;
      if (p_Var10 != local_208) {
        do {
          local_210 = psVar7;
          Json::Value::Value(&local_1e8,objectValue);
          Json::Value::Value(&local_80,(string *)(p_Var10 + 1));
          pVVar6 = Json::Value::operator[](&local_1e8,&kNAME_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar6,&local_80);
          Json::Value::~Value(&local_80);
          if (*(_Base_ptr *)(p_Var10 + 2) == p_Var10[2]._M_parent) {
            __assert_fail("!projectIt.second.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmJsonObjects.cxx"
                          ,0x275,"Json::Value DumpProjectList(const cmake *, const std::string &)");
          }
          this = *(cmMakefile **)(*(long *)*(_Base_ptr *)(p_Var10 + 2) + 0x28);
          local_248.string_ = (char *)&local_238;
          local_268 = (undefined8 *)0x1e;
          local_248.int_ = std::__cxx11::string::_M_create(&local_248.uint_,(ulong)&local_268);
          local_238._M_allocated_capacity = (size_type)local_268;
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
          *(char *)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header._M_parent =
               'Q';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 1) = 'U';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 2) = 'I';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 3) = 'R';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 4) = 'E';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 5) = 'D';
          builtin_strncpy((char *)((long)&(local_248.map_)->_M_t + 0x16),"_VERSION",8);
          builtin_strncpy((char *)local_248,"CMAKE_MI",8);
          *(char *)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header._M_color =
               'N';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_color + 1) = 'I';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_color + 2) = 'M';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_color + 3) = 'U';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x4 = 'M';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x5 = '_';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
          local_240 = local_268;
          local_248.string_[(long)local_268] = '\0';
          value = cmMakefile::GetDefinition(this,(string *)&local_248);
          if (local_248 != &local_238) {
            operator_delete(local_248.string_,local_238._M_allocated_capacity + 1);
          }
          if (value == (char *)0x0) {
            value = "";
          }
          Json::Value::Value(&local_58,value);
          pVVar6 = Json::Value::operator[](&local_1e8,&kMINIMUM_CMAKE_VERSION_abi_cxx11_);
          Json::Value::operator=(pVVar6,&local_58);
          Json::Value::~Value(&local_58);
          psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          Json::Value::Value(&local_a8,psVar7);
          pVVar6 = Json::Value::operator[](&local_1e8,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar6,&local_a8);
          Json::Value::~Value(&local_a8);
          psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          Json::Value::Value(&local_d0,psVar7);
          pVVar6 = Json::Value::operator[](&local_1e8,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar6,&local_d0);
          Json::Value::~Value(&local_d0);
          Json::Value::Value(&local_198,arrayValue);
          local_268 = (undefined8 *)0x0;
          puStack_260 = (undefined8 *)0x0;
          local_258 = 0;
          p_Var12 = *(_Base_ptr *)(p_Var10 + 2);
          p_Var1 = p_Var10[2]._M_parent;
          if (p_Var12 != p_Var1) {
            do {
              std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                        ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_268
                         ,puStack_260,*(undefined8 *)(*(long *)p_Var12 + 0x130),
                         *(undefined8 *)(*(long *)p_Var12 + 0x138));
              puVar3 = puStack_260;
              puVar11 = local_268;
              p_Var12 = (_Base_ptr)&p_Var12->_M_parent;
            } while (p_Var12 != p_Var1);
            if (local_268 != puStack_260) {
              uVar8 = (long)puStack_260 - (long)local_268 >> 3;
              lVar9 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_268,puStack_260,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar11,puVar3);
              puVar3 = puStack_260;
              for (puVar11 = local_268; puVar11 != puVar3; puVar11 = puVar11 + 1) {
                DumpTarget((Value *)&local_248,(cmGeneratorTarget *)*puVar11,value_00);
                bVar5 = Json::Value::isNull((Value *)&local_248);
                if (!bVar5) {
                  Json::Value::append(&local_198,(Value *)&local_248);
                }
                Json::Value::~Value((Value *)&local_248);
              }
            }
            if (local_268 != (undefined8 *)0x0) {
              operator_delete(local_268,local_258 - (long)local_268);
            }
          }
          pVVar6 = Json::Value::operator[](&local_1e8,&kTARGETS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar6,&local_198);
          Json::Value::~Value(&local_198);
          p_Var1 = p_Var10[2]._M_parent;
          for (p_Var12 = *(_Base_ptr *)(p_Var10 + 2); p_Var12 != p_Var1;
              p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
            plVar2 = *(long **)(*(long *)(*(long *)p_Var12 + 0x28) + 0x208);
            for (plVar13 = *(long **)(*(long *)(*(long *)p_Var12 + 0x28) + 0x200); plVar13 != plVar2
                ; plVar13 = plVar13 + 1) {
              bVar5 = true;
              if ((*plVar13 == 0) ||
                 (lVar9 = __dynamic_cast(*plVar13,&cmInstallGenerator::typeinfo,
                                         &cmInstallSubdirectoryGenerator::typeinfo,0), lVar9 == 0))
              goto LAB_003cb828;
            }
          }
          bVar5 = false;
LAB_003cb828:
          Json::Value::Value(&local_f8,bVar5);
          value_00 = local_210;
          pVVar6 = Json::Value::operator[](&local_1e8,&kHAS_INSTALL_RULE_abi_cxx11_);
          Json::Value::operator=(pVVar6,&local_f8);
          Json::Value::~Value(&local_f8);
          Json::Value::append(&local_148,&local_1e8);
          Json::Value::~Value(&local_1e8);
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          psVar7 = local_210;
        } while (p_Var10 != local_208);
      }
      pVVar6 = Json::Value::operator[](&local_170,&kPROJECTS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_148);
      Json::Value::~Value(&local_148);
      Json::Value::append(&local_1c0,&local_170);
      cm = local_220;
      Json::Value::~Value(&local_170);
      value_00 = value_00 + 1;
      pcVar4 = local_220;
    } while (value_00 != local_218);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  pVVar6 = Json::Value::operator[](local_250,&kCONFIGURATIONS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar6,&local_1c0);
  Json::Value::~Value(&local_1c0);
  return local_250;
}

Assistant:

Json::Value cmDumpCodeModel(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(cm);
  return result;
}